

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::prepareUniforms
          (ViewportIndexSubroutine *this,program *program,GLuint draw_call_index)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_50;
  GLuint local_38;
  int local_34;
  GLuint index;
  GLint location;
  GLchar *subroutine_name;
  Functions *gl;
  program *ppStack_18;
  GLuint draw_call_index_local;
  program *program_local;
  ViewportIndexSubroutine *this_local;
  
  gl._4_4_ = draw_call_index;
  ppStack_18 = program;
  program_local = (program *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_DrawTestBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  subroutine_name = (GLchar *)CONCAT44(extraout_var,iVar1);
  if (gl._4_4_ == 0) {
    local_50 = "four";
  }
  else {
    local_50 = "five";
  }
  _index = local_50;
  local_34 = Utils::program::getSubroutineUniformLocation(ppStack_18,"routine",0x8dd9);
  local_38 = Utils::program::getSubroutineIndex(ppStack_18,_index,0x8dd9);
  if (local_34 != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Something wrong, subroutine uniform location is not 0. Mistake in geometry shader?",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xed1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(subroutine_name + 0x1668))(0x8dd9,1,&local_38);
  err = (**(code **)(subroutine_name + 0x800))();
  glu::checkError(err,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xed5);
  return;
}

Assistant:

void ViewportIndexSubroutine::prepareUniforms(Utils::program& program, GLuint draw_call_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLchar* subroutine_name = (0 == draw_call_index) ? "four" : "five";

	GLint  location = program.getSubroutineUniformLocation("routine", GL_GEOMETRY_SHADER);
	GLuint index	= program.getSubroutineIndex(subroutine_name, GL_GEOMETRY_SHADER);

	if (0 != location)
	{
		TCU_FAIL("Something wrong, subroutine uniform location is not 0. Mistake in geometry shader?");
	}

	gl.uniformSubroutinesuiv(GL_GEOMETRY_SHADER, 1, &index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");
}